

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetBuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string make;
  string generator;
  ostringstream ss;
  allocator local_1f1;
  allocator local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator local_1b0 [32];
  ostream local_190;
  
  std::__cxx11::string::string((string *)&local_190,"CMAKE_GENERATOR",local_1f0);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,(string *)&local_190);
  std::__cxx11::string::string((string *)&local_1d0,pcVar2,local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string((string *)&local_190,"CMAKE_MAKE_PROGRAM",local_1b0);
  pcVar2 = cmMakefile::GetRequiredDefinition(mf,(string *)&local_190);
  std::__cxx11::string::string((string *)local_1f0,pcVar2,&local_1f1);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_1f0);
  bVar1 = std::operator==(&local_1d0,"NMake Makefiles");
  if (!bVar1) {
    bVar1 = std::operator==(&local_1d0,"Ninja");
    if (!bVar1) {
      bVar1 = std::operator==(&local_1d0,"MinGW Makefiles");
      if (!bVar1) {
        bVar1 = std::operator==(&local_1d0,"Unix Makefiles");
        if (!bVar1) goto LAB_00400311;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
      poVar3 = std::operator<<(&local_190,(string *)local_1f0);
      poVar3 = std::operator<<(poVar3," -j ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
      goto LAB_00400311;
    }
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
LAB_00400311:
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetBuildCommand(const cmMakefile* mf) const
{
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string buildCommand = make; // Default
  if ( generator == "NMake Makefiles" ||
       generator == "Ninja" )
    {
    buildCommand = make;
    }
  else if ( generator == "MinGW Makefiles" ||
            generator == "Unix Makefiles" )
    {
    std::ostringstream ss;
    ss << make << " -j " << this->CpuCount;
    buildCommand = ss.str();
    }
  return buildCommand;
}